

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
 mp::internal::ExprTypes::
 UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
           (Expr e)

{
  AssertionFailure *this;
  
  if ((*(uint *)e.super_ExprBase.impl_ & 0xfffffffe) == 0x44) {
    return (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
            )(Impl *)e.super_ExprBase.impl_;
  }
  this = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this,"invalid cast");
  __cxa_throw(this,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

expr::Kind kind() const { return kind_; }